

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int slice(int dim_num,int slice_num)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = i4_min(dim_num,slice_num);
  iVar3 = 0;
  if (-1 < iVar1) {
    iVar1 = -1;
    do {
      iVar1 = iVar1 + 1;
      iVar2 = i4_choose(slice_num,iVar1);
      iVar3 = iVar3 + iVar2;
      iVar2 = i4_min(dim_num,slice_num);
    } while (iVar1 < iVar2);
  }
  return iVar3;
}

Assistant:

int slice ( int dim_num, int slice_num )

//****************************************************************************80
//
//  Purpose:
//
//    SLICE: maximum number of pieces created by a given number of slices.
//
//  Discussion:
//
//    If we imagine slicing a pizza, each slice produce more pieces.  
//    The position of the slice affects the number of pieces created, but there
//    is a maximum.  
//
//    This function determines the maximum number of pieces created by a given
//    number of slices, applied to a space of a given dimension.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 August 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Robert Banks,
//    Slicing Pizzas, Racing Turtles, and Further Adventures in 
//    Applied Mathematics,
//    Princeton, 1999,
//    ISBN13: 9780691059471,
//    LC: QA93.B358.
//
//  Parameters:
//
//    Input, int DIM_NUM, the spatial dimension.
//
//    Input, int SLICE_NUM, the number of slices.
//
//    Input, int SLICE, the maximum number of pieces that can
//    be created by the given number of slices applied in the given dimension.
//
{
  int j;
  int piece_num;

  piece_num = 0;
  for ( j = 0; j <= i4_min ( dim_num, slice_num ); j++ )
  {
    piece_num = piece_num + i4_choose ( slice_num, j );
  }

  return piece_num;
}